

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void add_array_ptr_member_fn(File *fp,OffsetEntry *oe,char *format,int last)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcStack_20;
  int last_local;
  char *format_local;
  OffsetEntry *oe_local;
  File *fp_local;
  
  if (fp->binary == 0) {
    pcStack_20 = format;
    if ((*format == '&') && (iVar3 = strcmp(oe->name,"NULL"), iVar3 == 0)) {
      pcStack_20 = format + 1;
    }
    pcVar4 = ",";
    if (last != 0) {
      pcVar4 = "";
    }
    myfprintf(fp->fp,pcStack_20,oe->name,pcVar4);
    return;
  }
  add_array_member_internal(fp);
  *(long *)(fp->tables).cur = (long)oe->offset;
  if ((fp->relocations).v == (char **)0x0) {
    pcVar4 = (fp->tables).cur;
    pcVar2 = (fp->tables).start;
    (fp->relocations).v = (fp->relocations).e;
    uVar1 = (fp->relocations).n;
    (fp->relocations).n = uVar1 + 1;
    (fp->relocations).e[uVar1] = pcVar4 + -(long)pcVar2;
  }
  else {
    if ((fp->relocations).v == (fp->relocations).e) {
      if ((fp->relocations).n < 3) {
        pcVar4 = (fp->tables).cur;
        uVar1 = (fp->relocations).n;
        (fp->relocations).n = uVar1 + 1;
        (fp->relocations).v[uVar1] = pcVar4 + -(long)(fp->tables).start;
        goto LAB_0013cfdf;
      }
    }
    else if (((fp->relocations).n & 7) != 0) {
      pcVar4 = (fp->tables).cur;
      uVar1 = (fp->relocations).n;
      (fp->relocations).n = uVar1 + 1;
      (fp->relocations).v[uVar1] = pcVar4 + -(long)(fp->tables).start;
      goto LAB_0013cfdf;
    }
    vec_add_internal(&fp->relocations,(fp->tables).cur + -(long)(fp->tables).start);
  }
LAB_0013cfdf:
  (fp->tables).cur = (fp->tables).cur + fp->elem_size;
  return;
}

Assistant:

static void add_array_ptr_member_fn(File *fp, OffsetEntry *oe, char *format, int last) {
  if (fp->binary) {
    add_array_member_internal(fp);
    *(void **)fp->tables.cur = (void *)(intptr_t)oe->offset;
    vec_add(&fp->relocations, (void *)(fp->tables.cur - fp->tables.start));
    fp->tables.cur += fp->elem_size;
  } else {
    if (*format == '&' && strcmp(oe->name, "NULL") == 0) format++;
    fprintf(fp->fp, format, oe->name, last ? "" : ",");
  }
}